

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void serveTheDrinks(int bottles,string *beverage)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"here are ",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bottles);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bottles of ",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(beverage->_M_dataplus)._M_p,beverage->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void serveTheDrinks(int bottles, std::string beverage)
{
    std::cout << "here are " << bottles << " bottles of " << beverage << std::endl;
}